

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::
RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
::RefCntAutoPtr(RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                *this,ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
                      *pObj)

{
  this->m_pObject = pObj;
  if (pObj != (ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
               *)0x0) {
    RefCountedObject<Diligent::IDeviceObject>::AddRef
              ((RefCountedObject<Diligent::IDeviceObject> *)pObj);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }